

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall
QGraphicsDropShadowEffect::setBlurRadius(QGraphicsDropShadowEffect *this,qreal blurRadius)

{
  long lVar1;
  bool bVar2;
  qreal p1;
  
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  p1 = QPixmapDropShadowFilter::blurRadius(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8));
  bVar2 = qFuzzyCompare(p1,blurRadius);
  if (bVar2) {
    return;
  }
  QPixmapDropShadowFilter::setBlurRadius(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8),blurRadius);
  QGraphicsEffect::updateBoundingRect(&this->super_QGraphicsEffect);
  blurRadiusChanged(this,blurRadius);
  return;
}

Assistant:

void QGraphicsDropShadowEffect::setBlurRadius(qreal blurRadius)
{
    Q_D(QGraphicsDropShadowEffect);
    if (qFuzzyCompare(d->filter->blurRadius(), blurRadius))
        return;

    d->filter->setBlurRadius(blurRadius);
    updateBoundingRect();
    emit blurRadiusChanged(blurRadius);
}